

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

void ncnn::to_rgba2bgra(Mat *m,uchar *bgra,int stride)

{
  int *piVar1;
  int in_EDX;
  undefined1 *in_RSI;
  long *in_RDI;
  int remain;
  int y;
  float *ptr3;
  float *ptr2;
  float *ptr1;
  float *ptr0;
  int wgap;
  int h;
  int w;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  int local_438 [3];
  int local_42c [3];
  int local_420 [3];
  int local_414 [3];
  int local_408;
  int local_404;
  undefined8 local_400;
  undefined8 local_3f8;
  undefined8 local_3f0;
  undefined4 local_3e8;
  long local_3e0;
  undefined4 local_3d8;
  undefined4 local_3d4;
  undefined4 local_3d0;
  undefined4 local_3cc;
  undefined4 local_3c8;
  undefined8 local_3c0;
  float *local_3b8;
  undefined8 local_3b0;
  undefined8 local_3a8;
  undefined8 local_3a0;
  undefined4 local_398;
  long local_390;
  undefined4 local_388;
  undefined4 local_384;
  undefined4 local_380;
  undefined4 local_37c;
  undefined4 local_378;
  undefined8 local_370;
  float *local_368;
  undefined8 local_360;
  undefined8 local_358;
  undefined8 local_350;
  undefined4 local_348;
  long local_340;
  undefined4 local_338;
  undefined4 local_334;
  undefined4 local_330;
  undefined4 local_32c;
  undefined4 local_328;
  undefined8 local_320;
  float *local_318;
  undefined8 local_310;
  undefined8 local_308;
  undefined8 local_300;
  undefined4 local_2f8;
  long local_2f0;
  undefined4 local_2e8;
  undefined4 local_2e4;
  undefined4 local_2e0;
  undefined4 local_2dc;
  undefined4 local_2d8;
  undefined8 local_2d0;
  float *local_2c8;
  int local_2c0;
  int local_2bc;
  int local_2b8;
  undefined1 *local_2b0;
  undefined8 *local_2a0;
  undefined8 *local_298;
  undefined8 *local_290;
  undefined8 *local_288;
  undefined8 *local_278;
  undefined8 *local_268;
  undefined8 *local_258;
  undefined8 *local_248;
  undefined1 local_21d;
  undefined4 local_21c;
  undefined8 *local_210;
  long local_200;
  undefined4 local_1f4;
  long local_1f0;
  float *local_1e8;
  undefined4 local_1dc;
  int local_1d8;
  int local_1d4;
  undefined8 *local_1d0;
  undefined4 local_1c4;
  long local_1c0;
  undefined1 local_19d;
  undefined4 local_19c;
  undefined8 *local_190;
  long local_180;
  undefined4 local_174;
  long local_170;
  float *local_168;
  undefined4 local_15c;
  int local_158;
  int local_154;
  undefined8 *local_150;
  undefined4 local_144;
  long local_140;
  undefined1 local_11d;
  undefined4 local_11c;
  undefined8 *local_110;
  long local_100;
  undefined4 local_f4;
  long local_f0;
  float *local_e8;
  undefined4 local_dc;
  int local_d8;
  int local_d4;
  undefined8 *local_d0;
  undefined4 local_c4;
  long local_c0;
  undefined1 local_9d;
  undefined4 local_9c;
  undefined8 *local_90;
  long local_80;
  undefined4 local_74;
  long local_70;
  float *local_68;
  undefined4 local_5c;
  int local_58;
  int local_54;
  undefined8 *local_50;
  undefined4 local_44;
  long local_40;
  undefined8 *local_20;
  undefined8 *local_18;
  undefined8 *local_10;
  undefined8 *local_8;
  
  local_2b8 = *(int *)((long)in_RDI + 0x2c);
  local_2bc = (int)in_RDI[6];
  local_2c0 = in_EDX + local_2b8 * -4;
  if (local_2c0 == 0) {
    local_2b8 = local_2b8 * local_2bc;
    local_2bc = 1;
  }
  local_90 = &local_310;
  local_54 = *(int *)((long)in_RDI + 0x2c);
  local_58 = (int)in_RDI[6];
  local_5c = *(undefined4 *)((long)in_RDI + 0x34);
  local_2c8 = (float *)*in_RDI;
  local_70 = in_RDI[2];
  local_74 = (undefined4)in_RDI[3];
  local_80 = in_RDI[4];
  local_50 = &local_310;
  local_40 = (long)local_54 * (long)local_58 * local_70;
  local_8 = &local_310;
  local_2a0 = &local_310;
  local_110 = &local_360;
  local_d4 = *(int *)((long)in_RDI + 0x2c);
  local_d8 = (int)in_RDI[6];
  local_dc = *(undefined4 *)((long)in_RDI + 0x34);
  local_318 = (float *)(*in_RDI + in_RDI[8] * in_RDI[2]);
  local_f0 = in_RDI[2];
  local_f4 = (undefined4)in_RDI[3];
  local_100 = in_RDI[4];
  local_d0 = &local_360;
  local_c0 = (long)local_d4 * (long)local_d8 * local_f0;
  local_10 = &local_360;
  local_298 = &local_360;
  local_190 = &local_3b0;
  local_154 = *(int *)((long)in_RDI + 0x2c);
  local_158 = (int)in_RDI[6];
  local_15c = *(undefined4 *)((long)in_RDI + 0x34);
  local_368 = (float *)(*in_RDI + in_RDI[8] * 2 * in_RDI[2]);
  local_170 = in_RDI[2];
  local_174 = (undefined4)in_RDI[3];
  local_180 = in_RDI[4];
  local_150 = &local_3b0;
  local_140 = (long)local_154 * (long)local_158 * local_170;
  local_18 = &local_3b0;
  local_290 = &local_3b0;
  local_210 = &local_400;
  local_1d4 = *(int *)((long)in_RDI + 0x2c);
  local_1d8 = (int)in_RDI[6];
  local_1dc = *(undefined4 *)((long)in_RDI + 0x34);
  local_3b8 = (float *)(*in_RDI + in_RDI[8] * 3 * in_RDI[2]);
  local_1f0 = in_RDI[2];
  local_1f4 = (undefined4)in_RDI[3];
  local_200 = in_RDI[4];
  local_1d0 = &local_400;
  local_1c0 = (long)local_1d4 * (long)local_1d8 * local_1f0;
  local_20 = &local_400;
  local_288 = &local_400;
  local_2d8 = 0;
  local_2dc = 0;
  local_2e0 = 0;
  local_2e4 = 0;
  local_2f8 = 0;
  local_300 = 0;
  local_308 = 0;
  local_310 = 0;
  local_328 = 0;
  local_32c = 0;
  local_330 = 0;
  local_334 = 0;
  local_348 = 0;
  local_350 = 0;
  local_358 = 0;
  local_360 = 0;
  local_378 = 0;
  local_37c = 0;
  local_380 = 0;
  local_384 = 0;
  local_398 = 0;
  local_3a0 = 0;
  local_3a8 = 0;
  local_3b0 = 0;
  local_44 = 0x10;
  local_9c = 0;
  local_9d = 1;
  local_c4 = 0x10;
  local_11c = 1;
  local_11d = 1;
  local_144 = 0x10;
  local_19c = 2;
  local_19d = 1;
  local_1c4 = 0x10;
  local_21c = 3;
  local_21d = 1;
  local_2d0 = 0;
  local_2e8 = 0;
  local_320 = 0;
  local_338 = 0;
  local_370 = 0;
  local_388 = 0;
  local_400 = 0;
  local_3f0 = 0;
  local_3e8 = 0;
  local_3d8 = 0;
  local_3d4 = 0;
  local_3d0 = 0;
  local_3cc = 0;
  local_3c8 = 0;
  local_3c0 = 0;
  local_3f8 = 0;
  local_2b0 = in_RSI;
  local_278 = local_288;
  local_268 = local_290;
  local_258 = local_298;
  local_248 = local_2a0;
  local_1e8 = local_3b8;
  local_168 = local_368;
  local_e8 = local_318;
  local_68 = local_2c8;
  local_3e0 = local_200;
  local_390 = local_180;
  local_340 = local_100;
  local_2f0 = local_80;
  for (local_404 = 0; local_404 < local_2bc; local_404 = local_404 + 1) {
    for (local_408 = local_2b8; 0 < local_408; local_408 = local_408 + -1) {
      local_414[2] = (int)*local_368;
      local_414[1] = 0;
      piVar1 = std::max<int>(local_414 + 2,local_414 + 1);
      local_414[0] = 0xff;
      piVar1 = std::min<int>(piVar1,local_414);
      *local_2b0 = (char)*piVar1;
      local_420[2] = (int)*local_318;
      local_420[1] = 0;
      piVar1 = std::max<int>(local_420 + 2,local_420 + 1);
      local_420[0] = 0xff;
      piVar1 = std::min<int>(piVar1,local_420);
      local_2b0[1] = (char)*piVar1;
      local_42c[2] = (int)*local_2c8;
      local_42c[1] = 0;
      piVar1 = std::max<int>(local_42c + 2,local_42c + 1);
      local_42c[0] = 0xff;
      piVar1 = std::min<int>(piVar1,local_42c);
      local_2b0[2] = (char)*piVar1;
      local_438[2] = (int)*local_3b8;
      local_438[1] = 0;
      piVar1 = std::max<int>(local_438 + 2,local_438 + 1);
      local_438[0] = 0xff;
      piVar1 = std::min<int>(piVar1,local_438);
      local_2b0[3] = (char)*piVar1;
      local_2b0 = local_2b0 + 4;
      local_2c8 = local_2c8 + 1;
      local_318 = local_318 + 1;
      local_368 = local_368 + 1;
      local_3b8 = local_3b8 + 1;
    }
    local_2b0 = local_2b0 + local_2c0;
  }
  return;
}

Assistant:

static void to_rgba2bgra(const Mat& m, unsigned char* bgra, int stride)
{
    int w = m.w;
    int h = m.h;

    const int wgap = stride - w * 4;
    if (wgap == 0)
    {
        w = w * h;
        h = 1;
    }

    const float* ptr0 = m.channel(0);
    const float* ptr1 = m.channel(1);
    const float* ptr2 = m.channel(2);
    const float* ptr3 = m.channel(3);

    for (int y = 0; y < h; y++)
    {
#define SATURATE_CAST_UCHAR(X) (unsigned char)::std::min(::std::max((int)(X), 0), 255);

#if __ARM_NEON
        int nn = w >> 3;
        int remain = w - (nn << 3);
#else
        int remain = w;
#endif // __ARM_NEON

#if __ARM_NEON
        for (; nn > 0; nn--)
        {
            float32x4_t _rlow = vld1q_f32(ptr0);
            float32x4_t _rhigh = vld1q_f32(ptr0 + 4);
            float32x4_t _glow = vld1q_f32(ptr1);
            float32x4_t _ghigh = vld1q_f32(ptr1 + 4);
            float32x4_t _blow = vld1q_f32(ptr2);
            float32x4_t _bhigh = vld1q_f32(ptr2 + 4);
            float32x4_t _alow = vld1q_f32(ptr3);
            float32x4_t _ahigh = vld1q_f32(ptr3 + 4);

            int16x8_t _r16 = vcombine_s16(vmovn_s32(vcvtq_s32_f32(_rlow)), vmovn_s32(vcvtq_s32_f32(_rhigh)));
            int16x8_t _g16 = vcombine_s16(vmovn_s32(vcvtq_s32_f32(_glow)), vmovn_s32(vcvtq_s32_f32(_ghigh)));
            int16x8_t _b16 = vcombine_s16(vmovn_s32(vcvtq_s32_f32(_blow)), vmovn_s32(vcvtq_s32_f32(_bhigh)));
            int16x8_t _a16 = vcombine_s16(vmovn_s32(vcvtq_s32_f32(_alow)), vmovn_s32(vcvtq_s32_f32(_ahigh)));

            uint8x8x4_t _bgra;
            _bgra.val[0] = vqmovun_s16(_b16);
            _bgra.val[1] = vqmovun_s16(_g16);
            _bgra.val[2] = vqmovun_s16(_r16);
            _bgra.val[3] = vqmovun_s16(_a16);

            vst4_u8(bgra, _bgra);

            bgra += 4 * 8;
            ptr0 += 8;
            ptr1 += 8;
            ptr2 += 8;
            ptr3 += 8;
        }
#endif // __ARM_NEON
        for (; remain > 0; remain--)
        {
            bgra[0] = SATURATE_CAST_UCHAR(*ptr2);
            bgra[1] = SATURATE_CAST_UCHAR(*ptr1);
            bgra[2] = SATURATE_CAST_UCHAR(*ptr0);
            bgra[3] = SATURATE_CAST_UCHAR(*ptr3);

            bgra += 4;
            ptr0++;
            ptr1++;
            ptr2++;
            ptr3++;
        }

#undef SATURATE_CAST_UCHAR
        bgra += wgap;
    }
}